

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::MessageSetItemByteSize
                 (FieldDescriptor *field,Message *message)

{
  uint32_t uVar1;
  Reflection *this;
  size_t sVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  size_t sVar4;
  Message *sub_message;
  size_t message_size;
  size_t our_size;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  
  this = Message::GetReflection(message);
  uVar1 = FieldDescriptor::number(field);
  sVar2 = io::CodedOutputStream::VarintSize32(uVar1);
  pMVar3 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  uVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])();
  sVar4 = io::CodedOutputStream::VarintSize32(uVar1);
  return CONCAT44(extraout_var,uVar1) + sVar4 + sVar2 + 4;
}

Assistant:

size_t WireFormat::MessageSetItemByteSize(const FieldDescriptor* field,
                                          const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  size_t message_size;
    const Message& sub_message = message_reflection->GetMessage(message, field);
    message_size = sub_message.ByteSizeLong();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}